

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::~DelayedDestructor
          (DelayedDestructor<helics::Broker> *this)

{
  rep in_RAX;
  uint uVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  
  uVar1 = 0;
  local_28.__r = in_RAX;
  do {
    if ((this->ElementsToBeDestroyed).
        super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->ElementsToBeDestroyed).
        super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0023a0af:
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->tripDetect).lineDetector.
                  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      CLI::std::_Function_base::~_Function_base((_Function_base *)&this->callBeforeDeleteFunction);
      std::
      vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
      ~vector(&this->ElementsToBeDestroyed);
      return;
    }
    destroyObjects(this);
    if ((this->ElementsToBeDestroyed).
        super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->ElementsToBeDestroyed).
        super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (((((this->tripDetect).lineDetector.
             super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _M_base)._M_i & 1U) != 0) goto LAB_0023a0af;
      if (3 < uVar1) {
        destroyObjects(this);
        goto LAB_0023a0af;
      }
      if ((uVar1 & 1) == 0) {
        sched_yield();
      }
      else {
        local_28.__r = 100;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_28);
      }
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

~DelayedDestructor()
    {
        try {
            int ii = 0;
            while (!ElementsToBeDestroyed.empty()) {
                ++ii;
                destroyObjects();
                if (!ElementsToBeDestroyed.empty()) {
#ifdef ENABLE_TRIPWIRE
                    // short circuit if the tripline was triggered
                    if (tripDetect.isTripped()) {
                        return;
                    }
#endif
                    if (ii > 4) {
                        destroyObjects();
                        break;
                    }
                    if (ii % 2 == 0) {
                        std::this_thread::sleep_for(
                            std::chrono::milliseconds(100));
                    } else {
                        std::this_thread::yield();
                    }
                }
            }
        }
        catch (...) {
        }
    }